

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

DdNode * Llb_ImgComputeCube(Aig_Man_t *pAig,Vec_Int_t *vNodeIds,DdManager *dd)

{
  abctime aVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar3;
  abctime TimeStop;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bTemp;
  DdNode *bProd;
  DdManager *dd_local;
  Vec_Int_t *vNodeIds_local;
  Aig_Man_t *pAig_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bTemp = Cudd_ReadOne(dd);
  Cudd_Ref(bTemp);
  for (TimeStop._4_4_ = 0; iVar2 = Vec_IntSize(vNodeIds), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    iVar2 = Vec_IntEntry(vNodeIds,TimeStop._4_4_);
    pObj_00 = Aig_ManObj(pAig,iVar2);
    iVar2 = Aig_ObjId(pObj_00);
    pDVar3 = Cudd_bddIthVar(dd,iVar2);
    pDVar3 = Cudd_bddAnd(dd,bTemp,pDVar3);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bTemp);
    bTemp = pDVar3;
  }
  Cudd_Deref(bTemp);
  dd->TimeStop = aVar1;
  return bTemp;
}

Assistant:

DdNode * Llb_ImgComputeCube( Aig_Man_t * pAig, Vec_Int_t * vNodeIds, DdManager * dd )
{
    DdNode * bProd, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bProd = Cudd_ReadOne(dd);   Cudd_Ref( bProd );
    Aig_ManForEachObjVec( vNodeIds, pAig, pObj, i )
    {
        bProd  = Cudd_bddAnd( dd, bTemp = bProd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)) ); Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bProd );
    dd->TimeStop = TimeStop;
    return bProd;
}